

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O2

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ConvertNodeToPolicyAndAddToSolution
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,BGIP_BnB_NodePtr *node,
          double value)

{
  int *piVar1;
  sp_counted_base *psVar2;
  Index IVar3;
  size_t sVar4;
  ostream *poVar5;
  Index tI;
  size_t sVar6;
  uint agI;
  shared_ptr<JointPolicyPureVector> jpol;
  long *local_68;
  shared_count local_60;
  element_type *local_58;
  shared_count asStack_50 [2];
  shared_ptr<JointPolicyDiscretePure> local_40;
  
  (**(code **)(*(long *)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                         super_BGIP_IncrementalSolverInterface + 0x38))(&local_40,this);
  boost::dynamic_pointer_cast<JointPolicyPureVector,JointPolicyDiscretePure>
            ((boost *)&local_68,&local_40);
  boost::detail::shared_count::~shared_count(&local_40.pn);
  for (agI = 0; this->_m_nrAgents != (ulong)agI; agI = agI + 1) {
    sVar6 = 0;
    while( true ) {
      sVar4 = BayesianGameBase::GetNrTypes((BayesianGameBase *)(this->_m_bgip).px,agI);
      if (sVar4 == sVar6) break;
      local_58 = node->px;
      asStack_50[0].pi_ = (node->pn).pi_;
      psVar2 = (node->pn).pi_;
      if (psVar2 != (sp_counted_base *)0x0) {
        LOCK();
        piVar1 = &psVar2->use_count_;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      IVar3 = *(Index *)(*(long *)&(this->_m_depthFirstSpecified).
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[agI].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data + sVar6 * 4);
      boost::detail::shared_count::~shared_count(asStack_50);
      IVar3 = BGIP_BnB_Node::GetSpecifiedAction(node->px,agI,IVar3);
      (**(code **)(*local_68 + 0x80))(local_68,agI,sVar6,IVar3);
      sVar6 = (size_t)((int)sVar6 + 1);
    }
  }
  BGIPSolution::AddSolution
            ((JointPolicyPureVector *)
             &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
              super_BGIP_IncrementalSolverInterface.field_0x18,value);
  if (0 < this->_m_verbosity) {
    poVar5 = std::operator<<((ostream *)&std::cout,"BGIP_SolverBranchAndBound added solution ");
    std::ostream::_M_insert<void_const*>(poVar5);
    std::operator<<(poVar5," with value ");
    poVar5 = std::ostream::_M_insert<double>(value);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  boost::detail::shared_count::~shared_count(&local_60);
  return;
}

Assistant:

void ConvertNodeToPolicyAndAddToSolution(BGIP_BnB_NodePtr node, double value)
    {
        boost::shared_ptr<JP> jpol =  boost::dynamic_pointer_cast<JP>( this->GetNewJpol() );
        for(Index agI=0;agI!=_m_nrAgents;++agI)
            for(Index tI=0;tI!=_m_bgip->GetNrTypes(agI);++tI)
            {
                Index acI;
#if MAINTAIN_FULL_POL        
                acI = node->GetAction(agI,tI);
#else
#if 0 //CACHE_IMPLIED_JPOL
          // NO, this is not correct, because
          //_m_impliedJPol is not related to the particular node we are
          //computing this for
                acI = _m_impliedJPol[agI][tI];
#else          
                Index depth_tI = GetDepthFirstSpecified(agI,tI,node);
                acI = node->GetSpecifiedAction(agI, depth_tI);
#endif
#endif
                jpol->SetAction(agI,tI,acI);
            }
        this->
            AddSolution(*jpol, value);
        if(_m_verbosity>=1)
            std::cout << "BGIP_SolverBranchAndBound added solution " << jpol
                      << " with value " << value << std::endl;
    }